

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O0

int __thiscall pg::PSISolver::switch_strategy_seq(PSISolver *this,int pl)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Error *this_00;
  ostream *poVar5;
  char *pcVar6;
  _label_vertex _Var7;
  int local_18c;
  int local_184;
  int local_154;
  int local_14c;
  _label_vertex local_120;
  int local_10c;
  Game *pGStack_108;
  int n_1;
  int local_100;
  _label_vertex local_f8;
  Game *local_e8;
  int local_e0;
  _label_vertex local_d8;
  Game *local_c8;
  int local_c0;
  _label_vertex local_b8;
  Game *local_a8;
  int local_a0;
  _label_vertex local_98;
  Game *local_88;
  int local_80;
  _label_vertex local_78;
  Game *local_68;
  int local_60;
  _label_vertex local_58;
  int local_44;
  int *piStack_40;
  int to;
  int *curedge;
  byte local_2d;
  int cur_strat;
  bool changed;
  int local_1c;
  int local_18;
  int n;
  int res;
  int pl_local;
  PSISolver *this_local;
  
  local_18 = 0;
  local_1c = 0;
  n = pl;
  _res = this;
  do {
    lVar3 = (long)local_1c;
    lVar4 = Solver::nodecount(&this->super_Solver);
    if (lVar4 <= lVar3) {
      if (n == 0) {
        for (local_10c = 0; lVar3 = (long)local_10c, lVar4 = Solver::nodecount(&this->super_Solver),
            lVar3 < lVar4; local_10c = local_10c + 1) {
          if ((*(int *)(halt + (long)local_10c * 4) != 0) &&
             (bVar1 = si_val_less(this,-1,local_10c), bVar1)) {
            *(undefined4 *)(halt + (long)local_10c * 4) = 0;
            if (1 < (this->super_Solver).trace) {
              poVar5 = std::operator<<((this->super_Solver).logger,
                                       "\x1b[1;37mno longer halt\x1b[m before vertex ");
              _Var7 = Solver::label_vertex(&this->super_Solver,local_10c);
              local_120.g = _Var7.g;
              local_120.v = _Var7.v;
              poVar5 = operator<<(poVar5,&local_120);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            local_18 = local_18 + 1;
          }
        }
      }
      return local_18;
    }
    if (*(int *)(done + (long)local_1c * 4) != 3) {
      if (*(int *)(done + (long)local_1c * 4) == 0) {
        this_00 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_00,"logic error",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/psi.cpp"
                     ,0x16c);
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      iVar2 = Solver::owner(&this->super_Solver,local_1c);
      if (iVar2 == n) {
        local_2d = 0;
        curedge._4_4_ = *(int *)(pg::str + (long)local_1c * 4);
        for (piStack_40 = Solver::outs(&this->super_Solver,local_1c); *piStack_40 != -1;
            piStack_40 = piStack_40 + 1) {
          local_44 = *piStack_40;
          bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)local_44);
          if ((!bVar1) && (local_44 != curedge._4_4_)) {
            if (n == 0) {
              if (*(int *)(halt + (long)curedge._4_4_ * 4) == 0) {
                local_14c = curedge._4_4_;
              }
              else {
                local_14c = -1;
              }
              if (*(int *)(halt + (long)local_44 * 4) == 0) {
                local_154 = local_44;
              }
              else {
                local_154 = -1;
              }
              bVar1 = si_val_less(this,local_14c,local_154);
              if (bVar1) {
                if (1 < (this->super_Solver).trace) {
                  poVar5 = std::operator<<((this->super_Solver).logger,
                                           "\x1b[1;37mupdate even strategy\x1b[m \x1b[1;33m");
                  _Var7 = Solver::label_vertex(&this->super_Solver,local_1c);
                  local_68 = _Var7.g;
                  local_60 = _Var7.v;
                  local_58.g = local_68;
                  local_58.v = local_60;
                  poVar5 = operator<<(poVar5,&local_58);
                  poVar5 = std::operator<<(poVar5,"\x1b[m from \x1b[1;33m");
                  _Var7 = Solver::label_vertex(&this->super_Solver,curedge._4_4_);
                  local_88 = _Var7.g;
                  local_80 = _Var7.v;
                  local_78.g = local_88;
                  local_78.v = local_80;
                  poVar5 = operator<<(poVar5,&local_78);
                  poVar5 = std::operator<<(poVar5,"\x1b[m (");
                  iVar2 = si_top_val(this,curedge._4_4_);
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
                  pcVar6 = ")";
                  if (*(int *)(halt + (long)curedge._4_4_ * 4) != 0) {
                    pcVar6 = ")H";
                  }
                  poVar5 = std::operator<<(poVar5,pcVar6);
                  poVar5 = std::operator<<(poVar5," to \x1b[1;33m");
                  _Var7 = Solver::label_vertex(&this->super_Solver,local_44);
                  local_a8 = _Var7.g;
                  local_a0 = _Var7.v;
                  local_98.g = local_a8;
                  local_98.v = local_a0;
                  poVar5 = operator<<(poVar5,&local_98);
                  poVar5 = std::operator<<(poVar5,"\x1b[m (");
                  iVar2 = si_top_val(this,local_44);
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
                  pcVar6 = ")";
                  if (*(int *)(halt + (long)local_44 * 4) != 0) {
                    pcVar6 = ")H";
                  }
                  poVar5 = std::operator<<(poVar5,pcVar6);
                  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                }
                curedge._4_4_ = local_44;
                *(int *)(pg::str + (long)local_1c * 4) = local_44;
                local_2d = 1;
              }
            }
            else {
              if (*(int *)(halt + (long)local_44 * 4) == 0) {
                local_184 = local_44;
              }
              else {
                local_184 = -1;
              }
              if (*(int *)(halt + (long)curedge._4_4_ * 4) == 0) {
                local_18c = curedge._4_4_;
              }
              else {
                local_18c = -1;
              }
              bVar1 = si_val_less(this,local_184,local_18c);
              if (bVar1) {
                if (1 < (this->super_Solver).trace) {
                  poVar5 = std::operator<<((this->super_Solver).logger,
                                           "\x1b[1;37mupdate odd strategy\x1b[m \x1b[1;33m");
                  _Var7 = Solver::label_vertex(&this->super_Solver,local_1c);
                  local_c8 = _Var7.g;
                  local_c0 = _Var7.v;
                  local_b8.g = local_c8;
                  local_b8.v = local_c0;
                  poVar5 = operator<<(poVar5,&local_b8);
                  poVar5 = std::operator<<(poVar5,"\x1b[m from \x1b[1;33m");
                  _Var7 = Solver::label_vertex(&this->super_Solver,curedge._4_4_);
                  local_e8 = _Var7.g;
                  local_e0 = _Var7.v;
                  local_d8.g = local_e8;
                  local_d8.v = local_e0;
                  poVar5 = operator<<(poVar5,&local_d8);
                  poVar5 = std::operator<<(poVar5,"\x1b[m (");
                  iVar2 = si_top_val(this,curedge._4_4_);
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
                  pcVar6 = ")";
                  if (*(int *)(halt + (long)curedge._4_4_ * 4) != 0) {
                    pcVar6 = ")H";
                  }
                  poVar5 = std::operator<<(poVar5,pcVar6);
                  poVar5 = std::operator<<(poVar5," to \x1b[1;33m");
                  _Var7 = Solver::label_vertex(&this->super_Solver,local_44);
                  pGStack_108 = _Var7.g;
                  local_100 = _Var7.v;
                  local_f8.g = pGStack_108;
                  local_f8.v = local_100;
                  poVar5 = operator<<(poVar5,&local_f8);
                  poVar5 = std::operator<<(poVar5,"\x1b[m (");
                  iVar2 = si_top_val(this,local_44);
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
                  pcVar6 = ")";
                  if (*(int *)(halt + (long)local_44 * 4) != 0) {
                    pcVar6 = ")H";
                  }
                  poVar5 = std::operator<<(poVar5,pcVar6);
                  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                }
                curedge._4_4_ = local_44;
                *(int *)(pg::str + (long)local_1c * 4) = local_44;
                local_2d = 1;
              }
            }
          }
        }
        if ((local_2d & 1) != 0) {
          local_18 = local_18 + 1;
        }
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

int
PSISolver::switch_strategy_seq(int pl)
{
    int res = 0;

    for (int n=0; n<nodecount(); n++) {
        if (done[n] == 3) continue; // skip "disabled or won"
        if (done[n] == 0) LOGIC_ERROR; // expecting done==1 or done==2
        if (owner(n) != pl) continue; // only change strategy for vertices of player <pl>

        bool changed = false;
        int cur_strat = str[n];
        for (auto curedge = outs(n); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue; // skip strategy to disabled
            if (to == cur_strat) continue; // skip strategy to same
            if (pl == 0) {
                // improving for player Even
                if (si_val_less(halt[cur_strat] ? -1 : cur_strat, halt[to] ? -1 : to)) {
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;37mupdate even strategy\033[m \033[1;33m" << label_vertex(n) << "\033[m from \033[1;33m" << label_vertex(cur_strat) << "\033[m (" << si_top_val(cur_strat) << (halt[cur_strat]?")H":")") << " to \033[1;33m" << label_vertex(to) << "\033[m (" << si_top_val(to) << (halt[to] ? ")H" : ")") << std::endl;
                    }
#endif
                    str[n] = cur_strat = to;
                    changed = true;
                }
            } else {
                // improving for player Odd
                if (si_val_less(halt[to] ? -1 : to, halt[cur_strat] ? -1 : cur_strat)) {
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;37mupdate odd strategy\033[m \033[1;33m" << label_vertex(n) << "\033[m from \033[1;33m" << label_vertex(cur_strat) << "\033[m (" << si_top_val(cur_strat) << (halt[cur_strat]?")H":")") << " to \033[1;33m" << label_vertex(to) << "\033[m (" << si_top_val(to) << (halt[to] ? ")H" : ")") << std::endl;
                    }
#endif
                    str[n] = cur_strat = to;
                    changed = true;
                }
            }
        }
        if (changed) res++;
    }

    if (pl == 0) {
        for (int n=0; n<nodecount(); n++) {
            if (halt[n] and si_val_less(-1, n)) {
                halt[n] = 0; // stop halting
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "\033[1;37mno longer halt\033[m before vertex " << label_vertex(n) << std::endl;
                }
#endif
                res++;
            }
        }
    }

    return res;
}